

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
::reserve(vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  PrimarySample *pPVar6;
  long lVar7;
  int i;
  ulong uVar8;
  
  if (this->nAlloc < n) {
    pPVar6 = pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::
             allocate_object<pbrt::MLTSampler::PrimarySample>(&this->alloc,n);
    lVar7 = 0;
    for (uVar8 = 0; uVar8 < this->nStored; uVar8 = uVar8 + 1) {
      puVar1 = (undefined8 *)((long)&this->ptr->value + lVar7);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (undefined8 *)((long)&pPVar6->value + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar2[2] = uVar4;
      puVar2[3] = uVar5;
      lVar7 = lVar7 + 0x20;
    }
    pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::
    deallocate_object<pbrt::MLTSampler::PrimarySample>(&this->alloc,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pPVar6;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }